

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void subps_VW(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  bool bVar3;
  
  if ((pMyDisasm->Reserved_).PrefRepne == 1) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      bVar3 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
      IVar2 = 0x110002;
      if (bVar3) {
        IVar2 = 0x140002;
      }
      (pMyDisasm->Instruction).Category = IVar2;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vsubsd",7);
      if (bVar3) {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      if (((pMyDisasm->Reserved_).VEX.opcode == 0xc4) && ((pMyDisasm->Reserved_).REX.W_ == '\x01'))
      {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0xcc;
LAB_0011efe0:
      GyEy(pMyDisasm);
      return;
    }
    (pMyDisasm->Prefix).RepnePrefix = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Instruction).Category = 0x50002;
    (pMyDisasm->Instruction).Mnemonic[4] = 'd';
    (pMyDisasm->Instruction).Mnemonic[5] = '\0';
  }
  else {
    if ((pMyDisasm->Reserved_).PrefRepe != 1) {
      UVar1 = (pMyDisasm->Reserved_).VEX.state;
      if ((pMyDisasm->Prefix).OperandSize == '\x01') {
        if (UVar1 != '\x01') {
          (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
          (pMyDisasm->Prefix).OperandSize = '\b';
          (pMyDisasm->Reserved_).MemDecoration = 0x70;
          (pMyDisasm->Instruction).Category = 0x50002;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"subpd",6);
          goto LAB_0011f09e;
        }
        bVar3 = (pMyDisasm->Reserved_).EVEX.state != '\x01';
        IVar2 = 0x110002;
        if (!bVar3) {
          IVar2 = 0x140002;
        }
        (pMyDisasm->Instruction).Category = IVar2;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vsubpd",7);
        if (bVar3) goto LAB_0011f055;
      }
      else {
        if (UVar1 != '\x01') {
          (pMyDisasm->Reserved_).MemDecoration = 0x6d;
          (pMyDisasm->Instruction).Category = 0x40002;
          builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"subps",6);
          goto LAB_0011f09e;
        }
        bVar3 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
        IVar2 = 0x110002;
        if (bVar3) {
          IVar2 = 0x140002;
        }
        (pMyDisasm->Instruction).Category = IVar2;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vsubps",7);
        if (!bVar3) goto LAB_0011f055;
      }
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
LAB_0011f055:
      if (((pMyDisasm->Reserved_).VEX.opcode == 0xc4) && ((pMyDisasm->Reserved_).REX.W_ == '\x01'))
      {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      ArgsVEX(pMyDisasm);
      return;
    }
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      bVar3 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
      IVar2 = 0x110002;
      if (bVar3) {
        IVar2 = 0x140002;
      }
      (pMyDisasm->Instruction).Category = IVar2;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vsubss",7);
      if (bVar3) {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
      }
      if (((pMyDisasm->Reserved_).VEX.opcode == 0xc4) && ((pMyDisasm->Reserved_).REX.W_ == '\x01'))
      {
        (pMyDisasm->Reserved_).OperandSize = 0x40;
      }
      (pMyDisasm->Reserved_).Register_ = 4;
      (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      goto LAB_0011efe0;
    }
    (pMyDisasm->Prefix).RepPrefix = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
    (pMyDisasm->Instruction).Category = 0x40002;
    (pMyDisasm->Instruction).Mnemonic[4] = 's';
    (pMyDisasm->Instruction).Mnemonic[5] = '\0';
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"subs",4);
LAB_0011f09e:
  (pMyDisasm->Reserved_).Register_ = 4;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  (pMyDisasm->Operand1).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ subps_VW(PDISASM pMyDisasm)
{
   /* ========= 0xf2 */
   if (GV.PrefRepne == 1) {
      if (GV.VEX.state == InUsePrefix) {
        pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
        pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vsubsd");
        #endif
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
        if ((GV.VEX.opcode == 0xc4) && (GV.REX.W_ == 0x1)) GV.OperandSize = 64;
        GV.Register_ = SSE_REG;
        GV.MemDecoration = Arg3qword;
        GyEy(pMyDisasm);
      }
      else {
        pMyDisasm->Prefix.RepnePrefix = MandatoryPrefix;
        GV.MemDecoration = Arg2qword;
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "subsd");
        #endif
        GV.Register_ = SSE_REG;
        GxEx(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
      }
   }
   /* ========= 0xf3 */
   else if (GV.PrefRepe == 1) {
       if (GV.VEX.state == InUsePrefix) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vsubss");
        #endif
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
        if ((GV.VEX.opcode == 0xc4) && (GV.REX.W_ == 0x1)) GV.OperandSize = 64;
        GV.Register_ = SSE_REG;
        GV.MemDecoration = Arg3dword;
        GyEy(pMyDisasm);
       }
       else {
        pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
        GV.MemDecoration = Arg2dword;
        pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "subss");
        #endif
        GV.Register_ = SSE_REG;
        GxEx(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
       }
   }
   /* ========== 0x66 */
   else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       if (GV.VEX.state == InUsePrefix) {
           pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
           pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vsubpd");
           #endif
           if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
           if ((GV.VEX.opcode == 0xc4) && (GV.REX.W_ == 0x1)) GV.OperandSize = 64;
           ArgsVEX(pMyDisasm);
       }
       else {
           GV.OperandSize = GV.OriginalOperandSize;
           pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
           GV.MemDecoration = Arg2_m128d_xmm;
           pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+ARITHMETIC_INSTRUCTION;
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "subpd");
           #endif
           GV.Register_ = SSE_REG;
           GxEx(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
       }
  }
  else {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vsubps");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      if ((GV.VEX.opcode == 0xc4) && (GV.REX.W_ == 0x1)) GV.OperandSize = 64;
      ArgsVEX(pMyDisasm);
    }
    else {
      GV.MemDecoration = Arg2_m128_xmm;
      pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "subps");
      #endif
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ + WRITE;
    }
  }
}